

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mfsStrash.c
# Opt level: O3

void Abc_MfsConvertAigToHop_rec(Aig_Obj_t *pObj,Hop_Man_t *pHop)

{
  ulong uVar1;
  Hop_Obj_t *p1;
  Hop_Obj_t *pHVar2;
  
  if (((ulong)pObj & 1) != 0) {
    __assert_fail("!Aig_IsComplement(pObj)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/opt/mfs/mfsStrash.c"
                  ,0x2e,"void Abc_MfsConvertAigToHop_rec(Aig_Obj_t *, Hop_Man_t *)");
  }
  if ((pObj->field_5).pData == (void *)0x0) {
    Abc_MfsConvertAigToHop_rec((Aig_Obj_t *)((ulong)pObj->pFanin0 & 0xfffffffffffffffe),pHop);
    Abc_MfsConvertAigToHop_rec((Aig_Obj_t *)((ulong)pObj->pFanin1 & 0xfffffffffffffffe),pHop);
    uVar1 = (ulong)pObj->pFanin0 & 0xfffffffffffffffe;
    if (uVar1 == 0) {
      pHVar2 = (Hop_Obj_t *)0x0;
    }
    else {
      pHVar2 = (Hop_Obj_t *)((ulong)((uint)pObj->pFanin0 & 1) ^ *(ulong *)(uVar1 + 0x28));
    }
    uVar1 = (ulong)pObj->pFanin1 & 0xfffffffffffffffe;
    if (uVar1 == 0) {
      p1 = (Hop_Obj_t *)0x0;
    }
    else {
      p1 = (Hop_Obj_t *)((ulong)((uint)pObj->pFanin1 & 1) ^ *(ulong *)(uVar1 + 0x28));
    }
    pHVar2 = Hop_And(pHop,pHVar2,p1);
    (pObj->field_5).pData = pHVar2;
    if (((ulong)pHVar2 & 1) != 0) {
      __assert_fail("!Hop_IsComplement((Hop_Obj_t *)pObj->pData)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/opt/mfs/mfsStrash.c"
                    ,0x34,"void Abc_MfsConvertAigToHop_rec(Aig_Obj_t *, Hop_Man_t *)");
    }
  }
  return;
}

Assistant:

ABC_NAMESPACE_IMPL_START

////////////////////////////////////////////////////////////////////////
///                        DECLARATIONS                              ///
////////////////////////////////////////////////////////////////////////

////////////////////////////////////////////////////////////////////////
///                     FUNCTION DEFINITIONS                         ///
////////////////////////////////////////////////////////////////////////

/**Function*************************************************************

  Synopsis    [Recursively converts AIG from Aig_Man_t into Hop_Obj_t.]

  Description []
               
  SideEffects []

  SeeAlso     []

***********************************************************************/
void Abc_MfsConvertAigToHop_rec( Aig_Obj_t * pObj, Hop_Man_t * pHop )
{
    assert( !Aig_IsComplement(pObj) );
    if ( pObj->pData )
        return;
    Abc_MfsConvertAigToHop_rec( Aig_ObjFanin0(pObj), pHop ); 
    Abc_MfsConvertAigToHop_rec( Aig_ObjFanin1(pObj), pHop );
    pObj->pData = Hop_And( pHop, (Hop_Obj_t *)Aig_ObjChild0Copy(pObj), (Hop_Obj_t *)Aig_ObjChild1Copy(pObj) ); 
    assert( !Hop_IsComplement((Hop_Obj_t *)pObj->pData) );
}